

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

void __thiscall geometrycentral::surface::SurfaceMesh::deleteElement(SurfaceMesh *this,Edge e)

{
  runtime_error *this_00;
  allocator local_f9;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->useImplicitTwinFlag != true) {
    (this->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start
    [e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind] =
         0xffffffffffffffff;
    this->nEdgesCount = this->nEdgesCount - 1;
    this->modificationTick = this->modificationTick + 1;
    this->isCompressedFlag = false;
    return;
  }
  this_00 = (runtime_error *)
            __cxa_allocate_exception
                      (0x10,e.
                            super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                            .mesh);
  ::std::__cxx11::string::string
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]nonmanifold-laplacian/deps/geometry-central/src/surface/surface_mesh.cpp"
             ,&local_f9);
  ::std::operator+(&local_b8,"GC_SAFETY_ASSERT FAILURE from ",&local_d8);
  ::std::operator+(&local_98,&local_b8,":");
  ::std::__cxx11::to_string(&local_f8,0x68c);
  ::std::operator+(&local_78,&local_98,&local_f8);
  ::std::operator+(&local_58,&local_78," - ");
  ::std::operator+(&local_38,&local_58,"cannot delete a single edge with implict twin");
  ::std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SurfaceMesh::deleteElement(Edge e) {
  GC_SAFETY_ASSERT(!usesImplicitTwin(), "cannot delete a single edge with implict twin");

  size_t i = e.getIndex();
  eHalfedgeArr[e.getIndex()] = INVALID_IND;
  nEdgesCount--;

  modificationTick++;
  isCompressedFlag = false;
}